

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

void __thiscall
directed_flag_complex_t::worker_thread<directed_flag_complex_computer::compute_filtration_t>
          (directed_flag_complex_t *this,size_t number_of_threads,int thread_id,
          compute_filtration_t *f,int min_dimension,int max_dimension)

{
  vertex_index_t vVar1;
  allocator_type *__a;
  compute_filtration_t *in_RCX;
  int in_EDX;
  long in_RSI;
  compute_filtration_t *in_RDI;
  int in_R9D;
  directed_flag_complex_t *unaff_retaddr;
  unsigned_short in_stack_00000010;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  size_t index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> first_position_vertices;
  size_t number_of_vertices;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff50;
  undefined1 *__n;
  undefined1 local_81 [47];
  undefined2 local_52;
  ulong local_50;
  ulong local_30;
  int local_28;
  undefined4 in_stack_ffffffffffffffe8;
  compute_filtration_t *f_00;
  
  local_28 = in_R9D;
  f_00 = in_RDI;
  vVar1 = directed_graph_t::vertex_number(*(directed_graph_t **)in_RDI);
  local_30 = (ulong)vVar1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1aa580);
  for (local_50 = (ulong)in_EDX; local_50 < local_30; local_50 = in_RSI + local_50) {
    local_52 = (undefined2)local_50;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffff50,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
              );
  }
  __a = (allocator_type *)(long)(local_28 + 1);
  __n = local_81;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x1aa5ff);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI,(size_type)__n,__a);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x1aa61f);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1aa64c);
  do_for_each_cell<directed_flag_complex_computer::compute_filtration_t>
            (unaff_retaddr,f_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(vertex_index_t *)in_RCX,in_stack_00000010);
  directed_flag_complex_computer::compute_filtration_t::done(in_RCX);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)__a);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)__a);
  return;
}

Assistant:

void worker_thread(size_t number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const size_t number_of_vertices = graph.vertex_number();

		std::vector<vertex_index_t> first_position_vertices;
		for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads)
			first_position_vertices.push_back(vertex_index_t(index));

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		do_for_each_cell(f, min_dimension, max_dimension, first_position_vertices, prefix.data(), 0);

		f.done();
	}